

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void print_usage(char *prog_name)

{
  printf("\nUsage: %s -f <input file name>\n    Options\n      -n: needed if input contains negative items\n      -a <alpha value>: alpha value\n      -s <store type>: type of store\n      -b <max sketch size>: max sketch size in case of bounded store\n      -o: for csv output\n\n"
         ,prog_name);
  return;
}

Assistant:

void print_usage(char *prog_name) {
    printf("\nUsage: %s -f <input file name>\n"
           "    Options\n"
           "      -n: needed if input contains negative items\n"
           "      -a <alpha value>: alpha value\n"
           "      -s <store type>: type of store\n"
           "      -b <max sketch size>: max sketch size in case of bounded store\n"
           "      -o: for csv output\n\n", prog_name);
}